

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

_Bool duckdb_je_hpa_central_init(hpa_central_t *central,base_t *base,hpa_hooks_t *hooks)

{
  _func_void_void_ptr_size_t *p_Var1;
  _func_void_void_ptr_size_t *p_Var2;
  _func_void_void_ptr_size_t *p_Var3;
  _func_void_void_ptr_size_t *p_Var4;
  _func_void_nstime_t_ptr__Bool *p_Var5;
  _Bool _Var6;
  
  _Var6 = duckdb_je_malloc_mutex_init
                    (&central->grow_mtx,"hpa_central_grow",WITNESS_RANK_HPA_CENTRAL_GROW,
                     malloc_mutex_rank_exclusive);
  if (!_Var6) {
    central->base = base;
    central->age_counter = 0;
    central->eden = (void *)0x0;
    central->eden_len = 0;
    p_Var1 = hooks->unmap;
    p_Var2 = hooks->purge;
    p_Var3 = hooks->hugify;
    p_Var4 = hooks->dehugify;
    p_Var5 = hooks->curtime;
    (central->hooks).map = hooks->map;
    (central->hooks).unmap = p_Var1;
    (central->hooks).purge = p_Var2;
    (central->hooks).hugify = p_Var3;
    (central->hooks).dehugify = p_Var4;
    (central->hooks).curtime = p_Var5;
    (central->hooks).ms_since = hooks->ms_since;
  }
  return _Var6;
}

Assistant:

bool
hpa_central_init(hpa_central_t *central, base_t *base, const hpa_hooks_t *hooks) {
	/* malloc_conf processing should have filtered out these cases. */
	assert(hpa_supported());
	bool err;
	err = malloc_mutex_init(&central->grow_mtx, "hpa_central_grow",
	    WITNESS_RANK_HPA_CENTRAL_GROW, malloc_mutex_rank_exclusive);
	if (err) {
		return true;
	}

	central->base = base;
	central->eden = NULL;
	central->eden_len = 0;
	central->age_counter = 0;
	central->hooks = *hooks;
	return false;
}